

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O0

void nh_describe_pos(int x,int y,nh_desc_buf *bufs)

{
  int iVar1;
  trap *ptVar2;
  int iVar3;
  bool bVar4;
  char *local_48;
  monst *local_38;
  trap *t;
  monst *mtmp;
  int monid;
  nh_desc_buf *bufs_local;
  int y_local;
  int x_local;
  
  iVar1 = dbuf_get_mon(x,y);
  bufs->bgdesc[0] = '\0';
  bufs->trapdesc[0] = '\0';
  bufs->objdesc[0] = '\0';
  bufs->mondesc[0] = '\0';
  bufs->invisdesc[0] = '\0';
  bufs->effectdesc[0] = '\0';
  bufs->objcount = -1;
  if (program_state.game_running == 0) {
    return;
  }
  iVar3 = exit_jmp_buf_valid + 1;
  bVar4 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar3;
  if ((bVar4) && (iVar3 = __sigsetjmp(exit_jmp_buf,1), iVar3 != 0)) {
    return;
  }
  describe_bg(x,y,*(uint *)(level->locations[x] + y) & 0x3f,bufs->bgdesc);
  if ((*(uint *)(level->locations[x] + y) >> 6 & 0x1f) != 0) {
    if (((iVar1 != 0) && (iVar1 + -1 < 0x193)) && ((u.ux != x || (u.uy != y)))) {
      if ((level->monsters[x][y] == (monst *)0x0) ||
         ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
        local_38 = (monst *)0x0;
      }
      else {
        local_38 = level->monsters[x][y];
      }
      if (((((local_38 != (monst *)0x0) && ((*(uint *)&local_38->field_0x60 >> 0x17 & 1) != 0)) &&
           ((viz_array[y][x] & 2U) != 0)) && (ptVar2 = t_at(level,x,y), ptVar2 != (trap *)0x0)) &&
         ((((ptVar2->field_0x8 & 0x1f) == 5 || ((ptVar2->field_0x8 & 0x1f) == 0xb)) ||
          (((ptVar2->field_0x8 & 0x1f) == 0xc || ((ptVar2->field_0x8 & 0x1f) == 0x13))))))
      goto LAB_002806fc;
    }
    strcpy(bufs->trapdesc,trapexplain[(int)((*(uint *)(level->locations[x] + y) >> 6 & 0x1f) - 1)]);
  }
LAB_002806fc:
  iVar3 = describe_object(x,y,(*(uint *)(level->locations[x] + y) >> 0xb & 0x3ff) - 1,bufs->objdesc)
  ;
  bufs->objcount = iVar3;
  describe_mon(x,y,iVar1 + -1,bufs->mondesc);
  if ((*(uint *)&level->locations[x][y].field_0x6 >> 3 & 1) != 0) {
    strcpy(bufs->invisdesc,"remembered, unseen, creature");
  }
  if (((u._1052_1_ & 1) != 0) && ((x != u.ux || (y != u.uy)))) {
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      local_48 = a_monnam(u.ustuck);
    }
    else {
      local_48 = "a monster";
    }
    sprintf(bufs->effectdesc,"interior of %s",local_48);
  }
  exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
  return;
}

Assistant:

void nh_describe_pos(int x, int y, struct nh_desc_buf *bufs)
{
    int monid = dbuf_get_mon(x, y);
    
    bufs->bgdesc[0] = '\0';
    bufs->trapdesc[0] = '\0';
    bufs->objdesc[0] = '\0';
    bufs->mondesc[0] = '\0';
    bufs->invisdesc[0] = '\0';
    bufs->effectdesc[0] = '\0';
    bufs->objcount = -1;
    
    if (!program_state.game_running || !api_entry_checkpoint())
	return;
    
    describe_bg(x, y, level->locations[x][y].mem_bg, bufs->bgdesc);
    
    if (level->locations[x][y].mem_trap) {
	/* Avoid "monster trapped in a web on a web" from describe_mon(). */
	const struct monst *mtmp;
	const struct trap *t;
	if (!(monid &&					/* monster seen */
		(monid - 1) < NUMMONS &&		/* not a monster warning */
		!(u.ux == x && u.uy == y) &&		/* not the hero */
		(mtmp = m_at(level, x, y)) &&		/* monster at location */
		(mtmp->mtrapped && cansee(x, y)) &&	/* mon seen in trap */
		(t = t_at(level, x, y)) &&		/* trap at location */
		(t->ttyp == BEAR_TRAP || t->ttyp == PIT ||
		 t->ttyp == SPIKED_PIT || t->ttyp == WEB)))
	    strcpy(bufs->trapdesc, trapexplain[level->locations[x][y].mem_trap - 1]);
    }
    
    bufs->objcount = describe_object(x, y, level->locations[x][y].mem_obj - 1,
				     bufs->objdesc);
    
    describe_mon(x, y, monid - 1, bufs->mondesc);
    
    if (level->locations[x][y].mem_invis)
	strcpy(bufs->invisdesc, invisexplain);
    
    if (u.uswallow && (x != u.ux || y != u.uy)) {
	/* all locations when swallowed other than the hero are the monster */
	sprintf(bufs->effectdesc, "interior of %s", Blind ? "a monster" : a_monnam(u.ustuck));
    }
    
    api_exit();
}